

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

Raster * rw::ps2::rasterCreate(Raster *raster)

{
  int32 iVar1;
  Raster *raster_local;
  
  iVar1 = getRasterFormat(raster);
  if (iVar1 == 0) {
    raster_local = (Raster *)0x0;
  }
  else {
    raster->pixels = (uint8 *)0x0;
    raster->palette = (uint8 *)0x0;
    raster->originalWidth = raster->width;
    raster->originalHeight = raster->height;
    raster->originalPixels = raster->pixels;
    raster_local = raster;
    if ((raster->width == 0) || (raster->height == 0)) {
      raster->flags = 0x80;
      raster->stride = 0;
      raster->originalStride = 0;
    }
    else {
      switch(raster->type) {
      case 0:
      case 4:
        raster_local = rasterCreateTexture(raster);
        break;
      case 1:
        raster->flags = 0x80;
        break;
      case 2:
        raster->flags = 0x80;
        break;
      default:
        raster_local = (Raster *)0x0;
        break;
      case 5:
        raster_local = (Raster *)0x0;
      }
    }
  }
  return raster_local;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	if(!getRasterFormat(raster))
		return nil;

	// init raster
	raster->pixels = nil;
	raster->palette = nil;
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalPixels = raster->pixels;
	if(raster->width == 0 || raster->height == 0){
		raster->flags = Raster::DONTALLOCATE;
		raster->stride = 0;
		raster->originalStride = 0;
		return raster;
	}

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		return rasterCreateTexture(raster);
	case Raster::ZBUFFER:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERA:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERATEXTURE:
		// TODO. only RW_PS2
		// check width/height and fall through to texture
		return nil;
	}
	return nil;
}